

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O2

string * GetDatetimeWithoutSpecialChars_abi_cxx11_(void)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  string *in_RDI;
  char local_c [4];
  
  GetDatetime_abi_cxx11_();
  _Var1._M_current = (in_RDI->_M_dataplus)._M_p;
  local_c[3] = 0x20;
  local_c[2] = 0x5f;
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (_Var1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(_Var1._M_current + in_RDI->_M_string_length),local_c + 3,local_c + 2);
  _Var1._M_current = (in_RDI->_M_dataplus)._M_p;
  local_c[1] = 0x3a;
  local_c[0] = '.';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (_Var1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(_Var1._M_current + in_RDI->_M_string_length),local_c + 1,local_c);
  return in_RDI;
}

Assistant:

string GetDatetimeWithoutSpecialChars()
{
    string datetime(GetDatetime());
    std::replace(datetime.begin(), datetime.end(), ' ', '_');
    std::replace(datetime.begin(), datetime.end(), ':', '.');
    return datetime;
}